

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis(ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *this,Func *work)

{
  pointer puVar1;
  Function *pFVar2;
  TypeInfos *pTVar3;
  pointer puVar4;
  Module *module;
  PassRunner local_2a8;
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> local_1b8;
  undefined1 local_78 [16];
  code *local_68;
  _Any_data local_58;
  code *local_48;
  ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *local_38;
  
  module = this->wasm;
  puVar4 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    local_38 = this;
    do {
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
        local_2a8._vptr_PassRunner = (_func_int **)pFVar2;
        pTVar3 = (TypeInfos *)
                 std::
                 map<wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_>_>_>
                 ::operator[]((map<wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_>_>_>
                               *)&this->field_0x8,(key_type *)&local_2a8);
        local_1b8.super_Pass._vptr_Pass = (_func_int **)pFVar2;
        if ((work->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*work->_M_invoker)((_Any_data *)work,(Function **)&local_1b8,pTVar3);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
    module = local_38->wasm;
    this = local_38;
  }
  local_2a8.options.arguments._M_h._M_buckets = &local_2a8.options.arguments._M_h._M_single_bucket;
  local_2a8._vptr_PassRunner = (_func_int **)&PTR__PassRunner_010714e0;
  local_2a8.allocator = &module->allocator;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_2a8.passes.
  super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_2a8._41_8_ = 0;
  local_2a8.options.validate = true;
  local_2a8.options.validateGlobally = true;
  local_2a8.options.optimizeLevel = 0;
  local_2a8.options.shrinkLevel = 0;
  local_2a8.options.inlining.alwaysInlineMaxSize = 2;
  local_2a8.options.inlining.oneCallerInlineMaxSize = 0xffffffff;
  local_2a8.options.inlining.flexibleInlineMaxSize = 0x14;
  local_2a8.options.inlining.allowFunctionsWithLoops = false;
  local_2a8.options.printStackIR.
  super__Optional_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_true,_true>._M_payload.
  super__Optional_payload_base<std::basic_ostream<char,_std::char_traits<char>_>_*>._M_engaged =
       false;
  local_2a8.options.targetJS = false;
  local_2a8.options.inlining.partialInliningIfs = 0;
  local_2a8.options.ignoreImplicitTraps = false;
  local_2a8.options.trapsNeverHappen = false;
  local_2a8.options.lowMemoryUnused = false;
  local_2a8.options.fastMath = false;
  local_2a8.options.zeroFilledMemory = false;
  local_2a8.options.closedWorld = false;
  local_2a8.options.debugInfo = false;
  local_2a8.options.generateStackIR = false;
  local_2a8.options.optimizeStackIR = false;
  local_2a8.options.arguments._M_h._M_bucket_count = 1;
  local_2a8.options.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.options.arguments._M_h._M_element_count = 0;
  local_2a8.options.arguments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8.options.arguments._M_h._M_rehash_policy._M_next_resize = 0;
  local_2a8.options.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2a8.options.passesToSkip._M_h._M_buckets =
       &local_2a8.options.passesToSkip._M_h._M_single_bucket;
  local_2a8.options.passesToSkip._M_h._M_bucket_count = 1;
  local_2a8.options.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.options.passesToSkip._M_h._M_element_count = 0;
  local_2a8.options.passesToSkip._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8.options.passesToSkip._M_h._M_rehash_policy._M_next_resize = 0;
  local_2a8.options.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2a8.isNested = false;
  local_2a8.addedPassesRemovedDWARF = false;
  local_2a8.wasm = module;
  std::function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>::function
            ((function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             &local_58,
             (function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             work);
  ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,5ul>,(wasm::Mutability)0,wasm::
  ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  SmallUnorderedSet<wasm::HeapType,5ul>&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::
  Function*,wasm::SmallUnorderedSet<wasm::HeapType,5ul>,std::less<wasm::Function*>,std::
  allocator<std::pair<wasm::Function*const,wasm::SmallUnorderedSet<wasm::HeapType,5ul>>>>&,std::
  function<void(wasm::Function*,wasm::SmallUnorderedSet<wasm::HeapType_5ul>__>_
            (&local_1b8,module,(Map *)&this->field_0x8,(Func *)&local_58);
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::run
            (&local_1b8,&local_2a8,this->wasm);
  local_1b8.super_Pass._vptr_Pass = (_func_int **)&PTR__Mapper_01075cb0;
  if (local_68 != (code *)0x0) {
    (*local_68)(local_78,local_78,3);
  }
  if (local_1b8.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
      super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                    super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                          super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                          super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
                          super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.flexible.
                          super__Vector_base<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_std::allocator<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Pass::~Pass(&local_1b8.super_Pass);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  PassRunner::~PassRunner(&local_2a8);
  return;
}

Assistant:

void doAnalysis(Func work) {
    // Run on the imports first. TODO: parallelize this too
    for (auto& func : wasm.functions) {
      if (func->imported()) {
        work(func.get(), map[func.get()]);
      }
    }

    struct Mapper : public WalkerPass<PostWalker<Mapper>> {
      bool isFunctionParallel() override { return true; }
      bool modifiesBinaryenIR() override { return Mut; }

      Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }

      void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }

    private:
      Module& module;
      Map& map;
      Func work;
    };

    PassRunner runner(&wasm);
    Mapper(wasm, map, work).run(&runner, &wasm);
  }